

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O0

Slice * __thiscall Imf_3_3::FrameBuffer::operator[](FrameBuffer *this,char *name)

{
  bool bVar1;
  ostream *poVar2;
  stringstream *text;
  pointer ppVar3;
  char *in_RSI;
  stringstream _iex_throw_s;
  iterator i;
  map<Imf_3_3::Name,_Imf_3_3::Slice,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Slice>_>_>
  *in_stack_fffffffffffffd28;
  Name *in_stack_fffffffffffffd30;
  stringstream local_2a8 [16];
  ostream local_298 [376];
  _Self local_120 [33];
  _Self local_18;
  char *local_10;
  
  local_10 = in_RSI;
  Name::Name(in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_3::Name,_Imf_3_3::Slice,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Slice>_>_>
       ::find(in_stack_fffffffffffffd28,(key_type *)0x13124b);
  local_120[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_3::Name,_Imf_3_3::Slice,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Slice>_>_>
       ::end(in_stack_fffffffffffffd28);
  bVar1 = std::operator==(&local_18,local_120);
  if (!bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Slice>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Slice>_> *)
                        in_stack_fffffffffffffd30);
    return &ppVar3->second;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_2a8);
  poVar2 = std::operator<<(local_298,"Cannot find frame buffer slice \"");
  poVar2 = std::operator<<(poVar2,local_10);
  std::operator<<(poVar2,"\".");
  text = (stringstream *)__cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc((ArgExc *)poVar2,text);
  __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

Slice&
FrameBuffer::operator[] (const char name[])
{
    SliceMap::iterator i = _map.find (name);

    if (i == _map.end ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot find frame buffer slice \"" << name << "\".");
    }

    return i->second;
}